

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementAssembly::IfcElementAssembly(IfcElementAssembly *this)

{
  *(undefined ***)&this->field_0x190 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x198 = 0;
  *(char **)&this->field_0x1a0 = "IfcElementAssembly";
  IfcElement::IfcElement(&this->super_IfcElement,&PTR_construction_vtable_24__0080a5b0);
  *(undefined8 *)&(this->super_IfcElement).field_0x140 = 0;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject = 0x80a4a8;
  *(undefined8 *)&this->field_0x190 = 0x80a598;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0x88 = 0x80a4d0;
  (this->super_IfcElement).super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x80a4f8;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.super_IfcObject.field_0xd0 = 0x80a520;
  *(undefined8 *)&(this->super_IfcElement).super_IfcProduct.field_0x100 = 0x80a548;
  *(undefined8 *)&(this->super_IfcElement).field_0x138 = 0x80a570;
  *(undefined1 **)&(this->super_IfcElement).field_0x148 = &this->field_0x158;
  *(undefined8 *)&this->field_0x150 = 0;
  this->field_0x158 = 0;
  this->field_0x168 = 0;
  (this->PredefinedType)._M_dataplus._M_p = (pointer)&(this->PredefinedType).field_2;
  (this->PredefinedType)._M_string_length = 0;
  (this->PredefinedType).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcElementAssembly() : Object("IfcElementAssembly") {}